

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::adjust_tree(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
              *this,size_t N,size_t NN)

{
  tree_type *this_00;
  aabb_type *this_01;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_02;
  reference prVar1;
  reference prVar2;
  reference prVar3;
  size_t sVar4;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *in_R8;
  node_type new_root;
  size_t local_d8;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *local_d0;
  point_type *local_c8;
  size_t local_c0;
  undefined1 local_b8 [16];
  type local_a8;
  stored_size_type local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  type local_50;
  
  this_00 = &this->tree_;
  local_d8 = NN;
  local_c0 = N;
  prVar1 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at(this_00,N);
  if (prVar1->parent == 0xffffffffffffffff) {
    local_b8[0] = false;
    local_b8._8_8_ = -NAN;
    local_78 = 0;
    dStack_70 = 0.0;
    local_68 = 0.0;
    dStack_60 = 0.0;
    local_58 = 0.0;
    boost::container::
    vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
    ::priv_push_back<unsigned_long_const&>
              ((vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
                *)(local_b8 + 0x10),&local_c0);
    boost::container::
    vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
    ::priv_push_back<unsigned_long_const&>
              ((vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
                *)(local_b8 + 0x10),&local_d8);
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,local_c0);
    prVar2 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,local_d8);
    expand<perior::point<double,2ul>>
              (&local_50,(perior *)&prVar1->box,&prVar2->box,
               (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
    dStack_70 = local_50.center.values_.elems[0];
    local_68 = local_50.center.values_.elems[1];
    dStack_60 = local_50.radius.values_.elems[0];
    local_58 = local_50.radius.values_.elems[1];
    sVar4 = add_node(this,(node_type *)local_b8);
    this->root_ = sVar4;
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,local_c0);
    prVar1->parent = sVar4;
    sVar4 = this->root_;
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,local_d8);
    prVar1->parent = sVar4;
  }
  else {
    prVar1 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,N);
    prVar2 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,NN);
    if (prVar1->parent != prVar2->parent) {
      __assert_fail("node.parent == partner.parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                    ,0x110,
                    "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::adjust_tree(const std::size_t, const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                   );
    }
    prVar3 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar1->parent);
    this_01 = &prVar3->box;
    local_d0 = this;
    expand<perior::point<double,2ul>>
              ((type *)local_b8,(perior *)this_01,&prVar1->box,
               (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
    this_02 = local_d0;
    (prVar3->box).center.values_.elems[0] = (double)CONCAT71(local_b8._1_7_,local_b8[0]);
    (prVar3->box).center.values_.elems[1] = (double)local_b8._8_8_;
    (prVar3->box).radius.values_.elems[0] = (double)local_a8._0_8_;
    (prVar3->box).radius.values_.elems[1] = (double)local_a8._8_8_;
    if ((prVar3->entry).
        super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
        .m_holder.m_size < 6) {
      local_c8 = &(prVar3->box).radius;
      expand<perior::point<double,2ul>>
                ((type *)local_b8,(perior *)this_01,&prVar2->box,
                 (rectangle<perior::point<double,_2UL>_> *)&this->boundary_,in_R8);
      (this_01->center).values_.elems[0] = (double)CONCAT71(local_b8._1_7_,local_b8[0]);
      (prVar3->box).center.values_.elems[1] = (double)local_b8._8_8_;
      (local_c8->values_).elems[0] = (double)local_a8._0_8_;
      (local_c8->values_).elems[1] = (double)local_a8._8_8_;
      boost::container::
      vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
      ::priv_push_back<unsigned_long_const&>
                ((vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
                  *)&prVar3->entry,&local_d8);
      adjust_tree(local_d0,prVar1->parent);
    }
    else {
      sVar4 = split_node(local_d0,prVar1->parent,local_d8);
      adjust_tree(this_02,prVar1->parent,sVar4);
    }
  }
  return;
}

Assistant:

void adjust_tree(const std::size_t N, const std::size_t NN)
    {
        if(tree_.at(N).parent == nil) // grow tree taller
        {
            node_type new_root(false, nil);
            new_root.entry.push_back(N);
            new_root.entry.push_back(NN);
            new_root.box = expand(tree_.at(N).box, tree_.at(NN).box, this->boundary_);
            this->root_ = this->add_node(new_root);

            this->tree_.at(N).parent = this->root_;
            this->tree_.at(NN).parent = this->root_;
            return;
        }
        else
        {
            const node_type& node    = tree_.at(N);
            const node_type& partner = tree_.at(NN);
            assert(node.parent == partner.parent);

            node_type& parent_ = tree_.at(node.parent);
            parent_.box = expand(parent_.box, node.box, this->boundary_); // for N

            if(parent_.has_enough_storage())
            {
                parent_.box = expand(parent_.box, partner.box, this->boundary_); // for NN
                parent_.entry.push_back(NN);
                return this->adjust_tree(node.parent);
            }
            else
            {
                const std::size_t PP = this->split_node(node.parent, NN);
                return this->adjust_tree(node.parent, PP);
            }
        }
    }